

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O3

void __thiscall irr::gui::CGUISpriteBank::clear(CGUISpriteBank *this)

{
  code *pcVar1;
  ITexture *pIVar2;
  pointer prVar3;
  pointer prVar4;
  _func_int *p_Var5;
  pointer ppIVar6;
  pointer ppIVar7;
  ulong uVar8;
  vector<irr::gui::SGUISprite,_std::allocator<irr::gui::SGUISprite>_> local_38;
  
  ppIVar7 = (this->Textures).m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar6 = (this->Textures).m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)ppIVar6 - (long)ppIVar7) >> 3) != 0) {
    uVar8 = 0;
    do {
      pIVar2 = ppIVar7[uVar8];
      if (pIVar2 != (ITexture *)0x0) {
        p_Var5 = pIVar2->_vptr_ITexture[0xfffffffffffffffd];
        pcVar1 = p_Var5 + 8 + (long)&(pIVar2->NamedPath).Path;
        *(int *)pcVar1 = *(int *)pcVar1 + -1;
        if (*(int *)pcVar1 == 0) {
          p_Var5 = (_func_int *)((long)&pIVar2->_vptr_ITexture + (long)p_Var5);
          (**(code **)(*(long *)p_Var5 + 8))(p_Var5);
          ppIVar7 = (this->Textures).m_data.
                    super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppIVar6 = (this->Textures).m_data.
                    super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < ((ulong)((long)ppIVar6 - (long)ppIVar7) >> 3 & 0xffffffff));
  }
  ppIVar6 = (this->Textures).m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->Textures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Textures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Textures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppIVar7 != (pointer)0x0) {
    operator_delete(ppIVar7,(long)ppIVar6 - (long)ppIVar7);
  }
  (this->Textures).is_sorted = true;
  local_38.super__Vector_base<irr::gui::SGUISprite,_std::allocator<irr::gui::SGUISprite>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)&(this->super_IGUISpriteBank).field_0x8;
  local_38.super__Vector_base<irr::gui::SGUISprite,_std::allocator<irr::gui::SGUISprite>_>._M_impl.
  super__Vector_impl_data._M_finish = *(pointer *)&(this->super_IGUISpriteBank).field_0x10;
  local_38.super__Vector_base<irr::gui::SGUISprite,_std::allocator<irr::gui::SGUISprite>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)&(this->super_IGUISpriteBank).field_0x18;
  *(undefined8 *)&(this->super_IGUISpriteBank).field_0x18 = 0;
  *(undefined8 *)&(this->super_IGUISpriteBank).field_0x8 = 0;
  *(undefined8 *)&(this->super_IGUISpriteBank).field_0x10 = 0;
  ::std::vector<irr::gui::SGUISprite,_std::allocator<irr::gui::SGUISprite>_>::~vector(&local_38);
  this->field_0x20 = 1;
  prVar3 = (this->Rectangles).m_data.
           super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  prVar4 = (this->Rectangles).m_data.
           super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->Rectangles).m_data.
  super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Rectangles).m_data.
  super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Rectangles).m_data.
  super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (prVar3 != (pointer)0x0) {
    operator_delete(prVar3,(long)prVar4 - (long)prVar3);
  }
  (this->Rectangles).is_sorted = true;
  return;
}

Assistant:

void CGUISpriteBank::clear()
{
	// drop textures
	for (u32 i = 0; i < Textures.size(); ++i) {
		if (Textures[i])
			Textures[i]->drop();
	}
	Textures.clear();
	Sprites.clear();
	Rectangles.clear();
}